

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZParFrontStructMatrix.cpp
# Opt level: O3

void * TPZParFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOT<double>_>::
       ElementAssemble(void *t)

{
  long object;
  TPZCompEl *pTVar1;
  TPZGuiInterface *this;
  bool bVar2;
  int iVar3;
  TPZCompEl **ppTVar4;
  TPZElementMatrixT<double> *this_00;
  TPZElementMatrixT<double> *this_01;
  long nelem;
  unique_lock<std::mutex> assemble_lock;
  unique_lock<std::mutex> local_60;
  long local_50;
  long local_48;
  TPZStack<long,_10> *local_40;
  TPZChunkVector<TPZCompEl_*,_10> *local_38;
  
  if (*(long *)((long)t + 0x150) < *(long *)((long)t + 0x160)) {
    local_38 = (TPZChunkVector<TPZCompEl_*,_10> *)(*(long *)((long)t + 8) + 0x40);
    local_40 = (TPZStack<long,_10> *)((long)t + 0x180);
    local_48 = (long)t + 0x1f0;
    local_50 = (long)t + 0x260;
    do {
      local_60._M_device = &mutex_element_assemble;
      local_60._M_owns = false;
      std::unique_lock<std::mutex>::lock(&local_60);
      local_60._M_owns = true;
      if (*(long *)((long)t + 400) == (long)*(int *)((long)t + 0x168)) {
        std::condition_variable::wait((unique_lock *)stackfull);
      }
      object = *(long *)((long)t + 0x150);
      if (object == *(long *)((long)t + 0x160)) {
        std::unique_lock<std::mutex>::unlock(&local_60);
        std::unique_lock<std::mutex>::~unique_lock(&local_60);
        return (void *)0x0;
      }
      *(long *)((long)t + 0x150) = object + 1;
      std::unique_lock<std::mutex>::unlock(&local_60);
      nelem = (long)*(int *)(*(long *)((long)t + 0x128) + object * 4);
      if (-1 < nelem) {
        ppTVar4 = TPZChunkVector<TPZCompEl_*,_10>::operator[](local_38,nelem);
        pTVar1 = *ppTVar4;
        if (pTVar1 != (TPZCompEl *)0x0) {
          this_00 = (TPZElementMatrixT<double> *)operator_new(0x4340);
          TPZElementMatrixT<double>::TPZElementMatrixT(this_00,*(TPZCompMesh **)((long)t + 8),EK);
          this_01 = (TPZElementMatrixT<double> *)operator_new(0x4340);
          TPZElementMatrixT<double>::TPZElementMatrixT(this_01,*(TPZCompMesh **)((long)t + 8),EF);
          (**(code **)(*(long *)pTVar1 + 0x108))(pTVar1,this_00,this_01);
          iVar3 = pthread_mutex_lock((pthread_mutex_t *)&mutex_global_assemble);
          if (iVar3 != 0) {
            std::__throw_system_error(iVar3);
          }
          TPZStack<long,_10>::Push(local_40,object);
          (**(code **)(*(long *)((long)t + 0x1f0) + 0x18))(local_48,*(long *)((long)t + 0x200) + 1);
          *(TPZElementMatrixT<double> **)
           (*(long *)((long)t + 0x1f8) + -8 + *(long *)((long)t + 0x200) * 8) = this_00;
          (**(code **)(*(long *)((long)t + 0x260) + 0x18))(local_50,*(long *)((long)t + 0x270) + 1);
          *(TPZElementMatrixT<double> **)
           (*(long *)((long)t + 0x268) + -8 + *(long *)((long)t + 0x270) * 8) = this_01;
          std::condition_variable::notify_all();
          pthread_mutex_unlock((pthread_mutex_t *)&mutex_global_assemble);
          if (((*(undefined8 **)((long)t + 0x148) != (undefined8 *)0x0) &&
              (this = (TPZGuiInterface *)**(undefined8 **)((long)t + 0x148),
              this != (TPZGuiInterface *)0x0)) && (bVar2 = TPZGuiInterface::AmIKilled(this), bVar2))
          {
            std::unique_lock<std::mutex>::~unique_lock(&local_60);
            break;
          }
        }
      }
      std::unique_lock<std::mutex>::~unique_lock(&local_60);
    } while (*(long *)((long)t + 0x150) < *(long *)((long)t + 0x160));
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "static void *TPZParFrontStructMatrix<TPZFrontNonSym<double>, double, TPZStructMatrixOT<STATE>>::ElementAssemble(void *) [TFront = TPZFrontNonSym<double>, TVar = double, TPar = TPZStructMatrixOT<STATE>]"
             ,0xc9);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," Falling through \n",0x12);
  return (void *)0x0;
}

Assistant:

void *TPZParFrontStructMatrix<TFront,TVar,TPar>::ElementAssemble(void *t){
    
    
	TPZParFrontStructMatrix<TFront,TVar,TPar> *parfront = (TPZParFrontStructMatrix<TFront,TVar,TPar> *) t;
	
	TPZAdmChunkVector<TPZCompEl *> &elementvec = parfront->fMesh->ElementVec();
	
	
	while(parfront->fCurrentElement < parfront->fNElements) {
		
		/**
		 *Lock mutex and search for an avilable element
		 *A global variable to be updated whenever a element is processed
		 */
		
		//Lock a mutex and get an element number
        std::unique_lock<std::mutex> assemble_lock(mutex_element_assemble);
//        assemble_lock.lock();

		//Stack is full and process must wait here!
		if(parfront->felnum.NElements()==parfront->fMaxStackSize)
        {
			/*          cout << "    Stack full" << endl;
			 cout << "    Waiting" << endl;
			 cout.flush();*/
			//cout << "Mutex unlocked on Condwait" << endl;
#ifdef PZ_LOG
            if (logger.isDebugEnabled())
			{
				std::stringstream sout;
				sout << "Entering cond_wait because of stack overflow ";
				LOGPZ_DEBUG(logger,sout.str())
			}
#endif
            stackfull.wait(assemble_lock);
			//cout << "Mutex LOCKED leaving Condwait" << endl;
			
        }
		
		//cout << "Locking mutex_element_assemble" << endl;
		//cout.flush();
		int64_t local_element = parfront->fCurrentElement;
		if(local_element==parfront->fNElements)
        {
            assemble_lock.unlock();
            return 0;
        }
		/*          cout << "All element matrices assembled" << endl;
		 return 0;
		 }
		 */
#ifdef PZ_LOG
        if (logger.isDebugEnabled())
		{
			std::stringstream sout;
			sout << "Computing element " << local_element;
			LOGPZ_DEBUG(logger,sout.str())
		}
#endif
		parfront->fCurrentElement++;
		//Unlock mutex and / or send a broadcast
		//cout << "Computing Element " << parfront->fCurrentElement << endl;
		//cout << "Unlocking mutex_element_assemble" << endl;
		//cout.flush();
        assemble_lock.unlock();

		
		if(parfront->fElementOrder[local_element] < 0) continue;
		TPZCompEl *el = elementvec[parfront->fElementOrder[local_element]];
		if(!el) continue;
		//		int dim = el->NumNodes();
		
		//Builds elements stiffness matrix
		auto *ek =
            new TPZElementMatrixT<TVar>(parfront->fMesh,TPZElementMatrix::EK);
		auto *ef =
            new TPZElementMatrixT<TVar>(parfront->fMesh,TPZElementMatrix::EF);
		
		el->CalcStiff(*ek, *ef);
		//Locks a mutex and adds element contribution to frontmatrix
		//if mutex is locked go to condwait waiting for an specific condvariable
		// este mutex deve ser outro mutex -> mutexassemble
        {
            std::lock_guard<std::mutex> global_ass(mutex_global_assemble);
            //cout << "Locking mutex_global_assemble" << endl;
            //cout << "Pushing variables to the stack" << endl;
            //cout.flush();
            
            // colocar ek, ef e o element_local no stack
            parfront->felnum.Push(local_element);
            parfront->fekstack.Push(ek);
            parfront->fefstack.Push(ef);
            
    #ifdef PZ_LOG
            if (logger.isDebugEnabled())
            {
                std::stringstream sout;
                sout << "Pushing element " << local_element << " on the stack, stack sizes " << parfront->felnum.NElements() << " " << parfront->fekstack.NElements() << " " << parfront->fefstack.NElements();
                LOGPZ_DEBUG(logger,sout.str())
            }
    #endif
            // Outro thread procura se stack contem o proximo elemento
            // qdo nao encontra entra em condwait de acordo com condassemble
            // isso ocorre num outro processo
            // Uma vez que uma nova ek foi adicionada ao stack
            // chame broadcast para acordar o thread que faz assemblagem global
            
            //cout << "Unlocking mutex_global_assemble" << endl;
            //cout << "Broadcasting condassemble" << endl;
            //cout.flush();
            
            /*     if(!(parfront->fCurrentElement%20)){
             cout << endl << "Computing " << parfront->fCurrentElement << " on thread " << std::this_thread::get_id() << endl;
             cout << " " << (100*parfront->fCurrentElement/parfront->fNElements) << "% Elements computed" << "     " << (100*parfront->fCurrentAssembled/parfront->fNElements) << "% Elements assembled" << endl;
             }
             cout << '*';
             cout.flush();
             */
            //Alterado cond_broadcast para cond_signal
            //invertendo a sequencia das chamadas
            condassemble.notify_all();
        }
		// o thread de assemblagem utiliza mutexassemble
		// e feito em outro thread     AssembleElement(el, ek, ef, stiffness, rhs);
		
		if(parfront->fGuiInterface) if(parfront->fGuiInterface->AmIKilled()){
			break;
		}
	}//fim for iel
	
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
	{
		std::stringstream sout;
		sout << __PRETTY_FUNCTION__ << " Falling through";
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	std::cout << __PRETTY_FUNCTION__ << " Falling through \n";
    
	return NULL;
	
}